

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.c
# Opt level: O3

void pair1_pipe_stop(void *arg)

{
  long lVar1;
  _Bool _Var2;
  nni_msg *m;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_mtx_lock((nni_mtx *)(lVar1 + 0x20));
  if (*(void **)(lVar1 + 0x10) == arg) {
    *(undefined8 *)(lVar1 + 0x10) = 0;
    if (*(char *)(lVar1 + 0x128) == '\x01') {
      m = nni_aio_get_msg((nni_aio *)((long)arg + 0x1d8));
      nni_msg_free(m);
      *(undefined1 *)(lVar1 + 0x128) = 0;
    }
    if (*(char *)(lVar1 + 0x129) == '\x01') {
      *(undefined1 *)(lVar1 + 0x129) = 0;
      nni_pollable_clear((nni_pollable *)(lVar1 + 0x108));
    }
    _Var2 = nni_lmq_empty((nni_lmq *)(lVar1 + 0xa8));
    if (_Var2) {
      nni_pollable_clear((nni_pollable *)(lVar1 + 0x118));
    }
  }
  nni_mtx_unlock((nni_mtx *)(lVar1 + 0x20));
  nni_aio_stop((nni_aio *)((long)arg + 0x10));
  nni_aio_stop((nni_aio *)((long)arg + 0x1d8));
  return;
}

Assistant:

static void
pair1_pipe_stop(void *arg)
{
	pair1_pipe *p = arg;
	pair1_sock *s = p->pair;

	nni_mtx_lock(&s->mtx);
	if (s->p == p) {
		s->p = NULL;
		if (s->rd_ready) {
			nni_msg *m = nni_aio_get_msg(&p->aio_recv);
			nni_msg_free(m);
			s->rd_ready = false;
		}
		if (s->wr_ready) {
			s->wr_ready = false;
			nni_pollable_clear(&s->writable);
		}
		if (nni_lmq_empty(&s->rmq)) {
			nni_pollable_clear(&s->readable);
		}
	}
	nni_mtx_unlock(&s->mtx);
	nni_aio_stop(&p->aio_send);
	nni_aio_stop(&p->aio_recv);
}